

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O1

uint64_t aom_var_2d_u16_sse2(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined8 uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined8 auStack_a8 [5];
  __m128i vsrc [8];
  
  lVar13 = (long)src * 2;
  if (width < 9) {
    uVar14 = 0;
    lVar12 = 0;
    lVar10 = 0;
  }
  else {
    lVar2 = (long)src_stride * 2;
    uVar14 = 0;
    lVar10 = 0;
    lVar12 = 0;
    do {
      pauVar17 = (undefined1 (*) [16])(lVar13 + uVar14 * 2);
      if (height < 9) {
        iVar18 = 0;
      }
      else {
        iVar11 = 0;
        do {
          lVar15 = 0;
          do {
            uVar7 = *(undefined8 *)(*pauVar17 + 8);
            *(undefined8 *)((long)auStack_a8 + lVar15) = *(undefined8 *)*pauVar17;
            *(undefined8 *)((long)auStack_a8 + lVar15 + 8) = uVar7;
            lVar15 = lVar15 + 0x10;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar2);
          } while (lVar15 != 0x80);
          iVar22 = 0;
          iVar23 = 0;
          iVar24 = 0;
          iVar25 = 0;
          lVar15 = 0;
          iVar18 = 0;
          iVar19 = 0;
          iVar20 = 0;
          iVar21 = 0;
          do {
            auVar27 = *(undefined1 (*) [16])((long)auStack_a8 + lVar15);
            auVar3._10_2_ = 0;
            auVar3._0_10_ = auVar27._0_10_;
            auVar3._12_2_ = auVar27._6_2_;
            auVar5._8_2_ = auVar27._4_2_;
            auVar5._0_8_ = auVar27._0_8_;
            auVar5._10_4_ = auVar3._10_4_;
            auVar8._6_8_ = 0;
            auVar8._0_6_ = auVar5._8_6_;
            iVar22 = (uint)auVar27._8_2_ + (uint)auVar27._0_2_ + iVar22;
            iVar23 = (uint)auVar27._10_2_ +
                     (int)CONCAT82(SUB148(auVar8 << 0x40,6),auVar27._2_2_) + iVar23;
            iVar24 = (uint)auVar27._12_2_ + auVar5._8_4_ + iVar24;
            iVar25 = (uint)auVar27._14_2_ + (auVar3._10_4_ >> 0x10) + iVar25;
            auVar27 = pmaddwd(auVar27,auVar27);
            iVar18 = iVar18 + auVar27._0_4_;
            iVar19 = iVar19 + auVar27._4_4_;
            iVar20 = iVar20 + auVar27._8_4_;
            iVar21 = iVar21 + auVar27._12_4_;
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0x80);
          lVar10 = lVar10 + (iVar25 + iVar23 + iVar24 + iVar22);
          lVar12 = lVar12 + (iVar21 + iVar19 + iVar20 + iVar18);
          iVar11 = iVar11 + 8;
          iVar18 = (height - 9U & 0xfffffff8) + 8;
        } while (iVar11 < height + -8);
      }
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      iVar22 = 0;
      iVar23 = 0;
      iVar24 = 0;
      iVar25 = 0;
      iVar26 = 0;
      iVar11 = height - iVar18;
      if (iVar11 != 0 && iVar18 <= height) {
        do {
          auVar27 = *pauVar17;
          auVar4._10_2_ = 0;
          auVar4._0_10_ = auVar27._0_10_;
          auVar4._12_2_ = auVar27._6_2_;
          auVar6._8_2_ = auVar27._4_2_;
          auVar6._0_8_ = auVar27._0_8_;
          auVar6._10_4_ = auVar4._10_4_;
          auVar9._6_8_ = 0;
          auVar9._0_6_ = auVar6._8_6_;
          iVar23 = (uint)auVar27._8_2_ + (uint)auVar27._0_2_ + iVar23;
          iVar24 = (uint)auVar27._10_2_ +
                   (int)CONCAT82(SUB148(auVar9 << 0x40,6),auVar27._2_2_) + iVar24;
          iVar25 = (uint)auVar27._12_2_ + auVar6._8_4_ + iVar25;
          iVar26 = (uint)auVar27._14_2_ + (auVar4._10_4_ >> 0x10) + iVar26;
          auVar27 = pmaddwd(auVar27,auVar27);
          iVar19 = iVar19 + auVar27._0_4_;
          iVar20 = iVar20 + auVar27._4_4_;
          iVar21 = iVar21 + auVar27._8_4_;
          iVar22 = iVar22 + auVar27._12_4_;
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar2);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      lVar10 = lVar10 + (iVar26 + iVar24 + iVar25 + iVar23);
      lVar12 = lVar12 + (iVar22 + iVar20 + iVar21 + iVar19);
      uVar14 = uVar14 + 8;
    } while ((long)uVar14 < (long)(width + -8));
  }
  if (0 < height) {
    iVar18 = 0;
    do {
      uVar16 = uVar14 & 0xffffffff;
      if ((int)uVar14 < width) {
        do {
          uVar1 = *(ushort *)(lVar13 + uVar16 * 2);
          lVar10 = lVar10 + (ulong)uVar1;
          lVar12 = lVar12 + (ulong)((uint)uVar1 * (uint)uVar1);
          uVar16 = uVar16 + 1;
        } while ((uint)width != uVar16);
      }
      iVar18 = iVar18 + 1;
      lVar13 = lVar13 + (long)src_stride * 2;
    } while (iVar18 != height);
  }
  return lVar12 - (ulong)(lVar10 * lVar10) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u16_sse2(uint8_t *src, int src_stride, int width,
                             int height) {
  uint16_t *srcp1 = CONVERT_TO_SHORTPTR(src), *srcp;
  uint64_t s = 0, ss = 0;
  __m128i vzero = _mm_setzero_si128();
  __m128i v_acc_sum = vzero;
  __m128i v_acc_sqs = vzero;
  int i, j;

  // Process 8 elements in a row
  for (i = 0; i < width - 8; i += 8) {
    srcp = srcp1 + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 8; j += 8) {
      __m128i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm_loadu_si128((__m128i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m128i vsrc0 = _mm_unpacklo_epi16(vsrc[k], vzero);
        __m128i vsrc1 = _mm_unpackhi_epi16(vsrc[k], vzero);
        v_acc_sum = _mm_add_epi32(vsrc0, v_acc_sum);
        v_acc_sum = _mm_add_epi32(vsrc1, v_acc_sum);

        __m128i vsqs0 = _mm_madd_epi16(vsrc[k], vsrc[k]);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      }

      // Update total sum and clear the vectors
      s += mm_accumulate_epi32(v_acc_sum);
      ss += mm_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m128i vsrc = _mm_loadu_si128((__m128i *)srcp);
      __m128i vsrc0 = _mm_unpacklo_epi16(vsrc, vzero);
      __m128i vsrc1 = _mm_unpackhi_epi16(vsrc, vzero);
      v_acc_sum = _mm_add_epi32(vsrc0, v_acc_sum);
      v_acc_sum = _mm_add_epi32(vsrc1, v_acc_sum);

      __m128i vsqs0 = _mm_madd_epi16(vsrc, vsrc);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm_accumulate_epi32(v_acc_sum);
    ss += mm_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = srcp1;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint16_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}